

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

int Aig_ManVerifyTopoOrder(Aig_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  char *__format;
  long lVar8;
  long lVar9;
  
  Aig_ManSetCioIds(p);
  Aig_ManIncrementTravId(p);
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      piVar1 = (int *)pVVar6->pArray[lVar9];
      if (piVar1 != (int *)0x0) {
        if (((uint)*(undefined8 *)(piVar1 + 6) & 7) - 7 < 0xfffffffe) {
          uVar3 = (uint)*(undefined8 *)(piVar1 + 6) & 7;
          if ((ulong)uVar3 - 3 < 2) {
            uVar7 = *(ulong *)(piVar1 + 2) & 0xfffffffffffffffe;
            if (*(int *)(uVar7 + 0x20) != p->nTravIds) goto LAB_00623a68;
          }
          else if (uVar3 == 2) {
            if (((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) &&
               (uVar3 = Tim_ManBoxForCi((Tim_Man_t *)p->pManTime,*piVar1), -1 < (int)uVar3)) {
              iVar4 = Tim_ManBoxInputFirst((Tim_Man_t *)p->pManTime,uVar3);
              uVar5 = Tim_ManBoxInputNum((Tim_Man_t *)p->pManTime,uVar3);
              if (0 < (int)uVar5) {
                lVar8 = (long)iVar4;
                uVar7 = (ulong)uVar5;
                do {
                  if ((iVar4 < 0) || (p->vCos->nSize <= lVar8)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  piVar2 = (int *)p->vCos->pArray[lVar8];
                  if (0xfffffffd < (piVar2[6] & 7U) - 7) {
                    __assert_fail("!Aig_ObjIsNode(pObj)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                                  ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
                  }
                  uVar5 = Tim_ManBoxForCo((Tim_Man_t *)p->pManTime,*piVar2);
                  if (uVar5 != uVar3) {
                    __assert_fail("Tim_ManBoxForCo( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pNext) ) == iBox"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                                  ,0x5a,"int Aig_ManVerifyTopoOrder(Aig_Man_t *)");
                  }
                  if (piVar2[8] != p->nTravIds) {
                    uVar5 = piVar2[9];
                    __format = "Box %d has input %d that is not in a topological order.\n";
                    goto LAB_00623a8a;
                  }
                  lVar8 = lVar8 + 1;
                  uVar7 = uVar7 - 1;
                } while (uVar7 != 0);
              }
            }
          }
          else {
            if (((ulong)piVar1 & 1) != 0) {
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                            ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
            }
            if (uVar3 != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                            ,0x65,"int Aig_ManVerifyTopoOrder(Aig_Man_t *)");
            }
          }
        }
        else {
          uVar7 = *(ulong *)(piVar1 + 2) & 0xfffffffffffffffe;
          if ((*(int *)(uVar7 + 0x20) != p->nTravIds) ||
             (uVar7 = *(ulong *)(piVar1 + 4) & 0xfffffffffffffffe,
             *(int *)(uVar7 + 0x20) != p->nTravIds)) {
LAB_00623a68:
            uVar3 = piVar1[9];
            uVar5 = *(uint *)(uVar7 + 0x24);
            __format = "Node %d has fanin %d that is not in a topological order.\n";
LAB_00623a8a:
            printf(__format,(ulong)uVar3,(ulong)uVar5);
            return 0;
          }
        }
        piVar1[8] = p->nTravIds;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = p->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  Aig_ManCleanCioIds(p);
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies that the objects are in a topo order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManVerifyTopoOrder( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pNext;
    int i, k, iBox, iTerm1, nTerms;
    Aig_ManSetCioIds( p );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
            pNext = Aig_ObjFanin1(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
        }
        else if ( Aig_ObjIsCo(pObj) || Aig_ObjIsBuf(pObj) )
        {
            pNext = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
            {
                printf( "Node %d has fanin %d that is not in a topological order.\n", pObj->Id, pNext->Id );
                return 0;
            }
        }
        else if ( Aig_ObjIsCi(pObj) )
        {
            if ( p->pManTime )
            {
                iBox = Tim_ManBoxForCi( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
                if ( iBox >= 0 ) // this is not a true PI
                {
                    iTerm1 = Tim_ManBoxInputFirst( (Tim_Man_t *)p->pManTime, iBox );
                    nTerms = Tim_ManBoxInputNum( (Tim_Man_t *)p->pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Aig_ManCo( p, iTerm1 + k );
                        assert( Tim_ManBoxForCo( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pNext) ) == iBox ); 
                        if ( !Aig_ObjIsTravIdCurrent(p,pNext) )
                        {
                            printf( "Box %d has input %d that is not in a topological order.\n", iBox, pNext->Id );
                            return 0;
                        }
                    }
                }
            }
        }
        else if ( !Aig_ObjIsConst1(pObj) )
            assert( 0 );
        Aig_ObjSetTravIdCurrent( p, pObj );
    }
    Aig_ManCleanCioIds( p );
    return 1;
}